

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSAPrivateKey.cpp
# Opt level: O1

ByteString * __thiscall
OSSLRSAPrivateKey::PKCS8Encode(ByteString *__return_storage_ptr__,OSSLRSAPrivateKey *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  EVP_PKEY *pkey;
  PKCS8_PRIV_KEY_INFO *a;
  uchar *priv;
  uchar *local_28;
  
  ByteString::ByteString(__return_storage_ptr__);
  if (this->rsa == (RSA *)0x0) {
    createOSSLKey(this);
  }
  if (this->rsa != (RSA *)0x0) {
    pkey = EVP_PKEY_new();
    if (pkey != (EVP_PKEY *)0x0) {
      iVar1 = EVP_PKEY_set1_RSA(pkey,(rsa_st *)this->rsa);
      if (iVar1 == 0) {
        EVP_PKEY_free(pkey);
      }
      else {
        a = EVP_PKEY2PKCS8(pkey);
        EVP_PKEY_free(pkey);
        if (a != (PKCS8_PRIV_KEY_INFO *)0x0) {
          uVar2 = i2d_PKCS8_PRIV_KEY_INFO(a,(uchar **)0x0);
          if ((int)uVar2 < 0) {
            PKCS8_PRIV_KEY_INFO_free(a);
          }
          else {
            ByteString::resize(__return_storage_ptr__,(ulong)uVar2);
            local_28 = ByteString::operator[](__return_storage_ptr__,0);
            uVar3 = i2d_PKCS8_PRIV_KEY_INFO(a,&local_28);
            PKCS8_PRIV_KEY_INFO_free(a);
            if (uVar3 != uVar2) {
              ByteString::wipe(__return_storage_ptr__,0);
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ByteString OSSLRSAPrivateKey::PKCS8Encode()
{
	ByteString der;
	if (rsa == NULL) createOSSLKey();
	if (rsa == NULL) return der;
	EVP_PKEY* pkey = EVP_PKEY_new();
	if (pkey == NULL) return der;
	if (!EVP_PKEY_set1_RSA(pkey, rsa))
	{
		EVP_PKEY_free(pkey);
		return der;
	}
	PKCS8_PRIV_KEY_INFO* p8inf = EVP_PKEY2PKCS8(pkey);
	EVP_PKEY_free(pkey);
	if (p8inf == NULL) return der;
	int len = i2d_PKCS8_PRIV_KEY_INFO(p8inf, NULL);
	if (len < 0)
	{
		PKCS8_PRIV_KEY_INFO_free(p8inf);
		return der;
	}
	der.resize(len);
	unsigned char* priv = &der[0];
	int len2 = i2d_PKCS8_PRIV_KEY_INFO(p8inf, &priv);
	PKCS8_PRIV_KEY_INFO_free(p8inf);
	if (len2 != len) der.wipe();
	return der;
}